

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_initialize_syminfo
              (backtrace_state *state,libbacktrace_base_address base_address,uchar *symtab_data,
              size_t symtab_size,uchar *strtab,size_t strtab_size,
              backtrace_error_callback error_callback,void *data,elf_syminfo_data *sdata,
              elf_ppc64_opd_data *opd)

{
  byte bVar1;
  elf_symbol *basearg;
  int info_1;
  int info;
  uint j;
  size_t i;
  elf_symbol *elf_symbols;
  size_t elf_symbol_size;
  size_t elf_symbol_count;
  b_elf_sym *sym;
  size_t sym_count;
  size_t strtab_size_local;
  uchar *strtab_local;
  size_t symtab_size_local;
  uchar *symtab_data_local;
  backtrace_state *state_local;
  libbacktrace_base_address base_address_local;
  
  elf_symbol_size = 0;
  elf_symbol_count = (size_t)symtab_data;
  for (_info = 0; _info < symtab_size / 0x18; _info = _info + 1) {
    bVar1 = *(byte *)(elf_symbol_count + 4) & 0xf;
    if (((bVar1 == 2) || (bVar1 == 1)) && (*(short *)(elf_symbol_count + 6) != 0)) {
      elf_symbol_size = elf_symbol_size + 1;
    }
    elf_symbol_count = elf_symbol_count + 0x18;
  }
  basearg = (elf_symbol *)tcmalloc_backtrace_alloc(state,elf_symbol_size * 0x18,error_callback,data)
  ;
  if (basearg == (elf_symbol *)0x0) {
    base_address_local.m._4_4_ = 0;
  }
  else {
    info_1 = 0;
    elf_symbol_count = (size_t)symtab_data;
    for (_info = 0; _info < symtab_size / 0x18; _info = _info + 1) {
      bVar1 = *(byte *)(elf_symbol_count + 4) & 0xf;
      if (((bVar1 == 2) || (bVar1 == 1)) && (*(short *)(elf_symbol_count + 6) != 0)) {
        if (strtab_size <= *(uint *)elf_symbol_count) {
          (*error_callback)(data,"symbol string index out of range",0);
          tcmalloc_backtrace_free(state,basearg,elf_symbol_size * 0x18,error_callback,data);
          return 0;
        }
        basearg[(uint)info_1].name = (char *)(strtab + *(uint *)elf_symbol_count);
        if (((opd == (elf_ppc64_opd_data *)0x0) || (*(ulong *)(elf_symbol_count + 8) < opd->addr))
           || (opd->addr + opd->size <= *(ulong *)(elf_symbol_count + 8))) {
          basearg[(uint)info_1].address = *(uintptr_t *)(elf_symbol_count + 8);
        }
        else {
          basearg[(uint)info_1].address =
               *(uintptr_t *)(opd->data + (*(long *)(elf_symbol_count + 8) - opd->addr));
        }
        basearg[(uint)info_1].address = basearg[(uint)info_1].address + base_address.m;
        basearg[(uint)info_1].size = *(size_t *)(elf_symbol_count + 0x10);
        info_1 = info_1 + 1;
      }
      elf_symbol_count = elf_symbol_count + 0x18;
    }
    tcmalloc_backtrace_qsort(basearg,elf_symbol_size,0x18,elf_symbol_compare);
    sdata->next = (elf_syminfo_data *)0x0;
    sdata->symbols = basearg;
    sdata->count = elf_symbol_size;
    base_address_local.m._4_4_ = 1;
  }
  return base_address_local.m._4_4_;
}

Assistant:

static int
elf_initialize_syminfo (struct backtrace_state *state,
			struct libbacktrace_base_address base_address,
			const unsigned char *symtab_data, size_t symtab_size,
			const unsigned char *strtab, size_t strtab_size,
			backtrace_error_callback error_callback,
			void *data, struct elf_syminfo_data *sdata,
			struct elf_ppc64_opd_data *opd)
{
  size_t sym_count;
  const b_elf_sym *sym;
  size_t elf_symbol_count;
  size_t elf_symbol_size;
  struct elf_symbol *elf_symbols;
  size_t i;
  unsigned int j;

  sym_count = symtab_size / sizeof (b_elf_sym);

  /* We only care about function symbols.  Count them.  */
  sym = (const b_elf_sym *) symtab_data;
  elf_symbol_count = 0;
  for (i = 0; i < sym_count; ++i, ++sym)
    {
      int info;

      info = sym->st_info & 0xf;
      if ((info == STT_FUNC || info == STT_OBJECT)
	  && sym->st_shndx != SHN_UNDEF)
	++elf_symbol_count;
    }

  elf_symbol_size = elf_symbol_count * sizeof (struct elf_symbol);
  elf_symbols = ((struct elf_symbol *)
		 backtrace_alloc (state, elf_symbol_size, error_callback,
				  data));
  if (elf_symbols == NULL)
    return 0;

  sym = (const b_elf_sym *) symtab_data;
  j = 0;
  for (i = 0; i < sym_count; ++i, ++sym)
    {
      int info;

      info = sym->st_info & 0xf;
      if (info != STT_FUNC && info != STT_OBJECT)
	continue;
      if (sym->st_shndx == SHN_UNDEF)
	continue;
      if (sym->st_name >= strtab_size)
	{
	  error_callback (data, "symbol string index out of range", 0);
	  backtrace_free (state, elf_symbols, elf_symbol_size, error_callback,
			  data);
	  return 0;
	}
      elf_symbols[j].name = (const char *) strtab + sym->st_name;
      /* Special case PowerPC64 ELFv1 symbols in .opd section, if the symbol
	 is a function descriptor, read the actual code address from the
	 descriptor.  */
      if (opd
	  && sym->st_value >= opd->addr
	  && sym->st_value < opd->addr + opd->size)
	elf_symbols[j].address
	  = *(const b_elf_addr *) (opd->data + (sym->st_value - opd->addr));
      else
	elf_symbols[j].address = sym->st_value;
      elf_symbols[j].address =
	libbacktrace_add_base (elf_symbols[j].address, base_address);
      elf_symbols[j].size = sym->st_size;
      ++j;
    }

  backtrace_qsort (elf_symbols, elf_symbol_count, sizeof (struct elf_symbol),
		   elf_symbol_compare);

  sdata->next = NULL;
  sdata->symbols = elf_symbols;
  sdata->count = elf_symbol_count;

  return 1;
}